

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int tinsert(lua_State *L)

{
  int n;
  size_t sVar1;
  lua_Integer lVar2;
  int iVar3;
  
  luaL_checktype(L,1,5);
  sVar1 = lua_objlen(L,1);
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  if (iVar3 == 2) {
    iVar3 = (int)sVar1 + 1;
  }
  else {
    if (iVar3 != 3) {
      luaL_error(L,"wrong number of arguments to \'insert\'");
    }
    lVar2 = luaL_checkinteger(L,2);
    iVar3 = (int)lVar2;
    if (iVar3 <= (int)sVar1) {
      do {
        n = (int)sVar1;
        lua_rawgeti(L,1,n);
        lua_rawseti(L,1,n + 1);
        sVar1 = (size_t)(n - 1);
      } while (iVar3 < n);
    }
  }
  lua_rawseti(L,1,iVar3);
  return 0;
}

Assistant:

static int tinsert(lua_State*L){
int e=aux_getn(L,1)+1;
int pos;
switch(lua_gettop(L)){
case 2:{
pos=e;
break;
}
case 3:{
int i;
pos=luaL_checkint(L,2);
if(pos>e)e=pos;
for(i=e;i>pos;i--){
lua_rawgeti(L,1,i-1);
lua_rawseti(L,1,i);
}
break;
}
default:{
return luaL_error(L,"wrong number of arguments to "LUA_QL("insert"));
}
}
luaL_setn(L,1,e);
lua_rawseti(L,1,pos);
return 0;
}